

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  float *pfVar1;
  unsigned_short *puVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImFontGlyph *pIVar10;
  ImFontGlyph *pIVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  int n;
  ushort uVar18;
  int iVar19;
  int iVar20;
  float fVar21;
  ImWchar dots_chars [2];
  ImWchar ellipsis_chars [2];
  ushort local_30 [4];
  
  uVar12 = (ulong)(uint)(this->Glyphs).Size;
  if (uVar12 == 0) {
    uVar17 = 1;
  }
  else {
    lVar14 = 0;
    uVar17 = 0;
    do {
      uVar16 = *(uint *)(&((this->Glyphs).Data)->field_0x0 + lVar14) >> 2;
      if (uVar16 < uVar17) {
        uVar16 = uVar17;
      }
      uVar17 = uVar16;
      lVar14 = lVar14 + 0x28;
    } while (uVar12 * 0x28 != lVar14);
    uVar17 = uVar17 + 1;
  }
  pfVar1 = (this->IndexAdvanceX).Data;
  if (pfVar1 != (float *)0x0) {
    (this->IndexAdvanceX).Size = 0;
    (this->IndexAdvanceX).Capacity = 0;
    ImGui::MemFree(pfVar1);
    (this->IndexAdvanceX).Data = (float *)0x0;
  }
  puVar2 = (this->IndexLookup).Data;
  if (puVar2 != (unsigned_short *)0x0) {
    (this->IndexLookup).Size = 0;
    (this->IndexLookup).Capacity = 0;
    ImGui::MemFree(puVar2);
    (this->IndexLookup).Data = (unsigned_short *)0x0;
  }
  this->DirtyLookupTables = false;
  this->Used4kPagesMap[0] = '\0';
  this->Used4kPagesMap[1] = '\0';
  GrowIndex(this,uVar17);
  iVar13 = (this->Glyphs).Size;
  if (0 < iVar13) {
    lVar14 = 4;
    lVar15 = 0;
    do {
      pIVar10 = (this->Glyphs).Data;
      uVar16 = *(uint *)((long)pIVar10 + lVar14 + -4);
      *(undefined4 *)((long)(this->IndexAdvanceX).Data + (ulong)(uVar16 & 0xfffffffc)) =
           *(undefined4 *)(&pIVar10->field_0x0 + lVar14);
      (this->IndexLookup).Data[uVar16 >> 2] = (unsigned_short)lVar15;
      this->Used4kPagesMap[uVar16 >> 0x11] =
           this->Used4kPagesMap[uVar16 >> 0x11] | (byte)(1 << ((byte)(uVar16 >> 0xe) & 7));
      lVar15 = lVar15 + 1;
      iVar13 = (this->Glyphs).Size;
      lVar14 = lVar14 + 0x28;
    } while (lVar15 < iVar13);
  }
  uVar16 = (this->IndexLookup).Size;
  if ((uVar16 < 0x21) || (uVar18 = (this->IndexLookup).Data[0x20], uVar18 == 0xffff)) {
    pIVar10 = this->FallbackGlyph;
  }
  else {
    pIVar10 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar18 * 0x28);
  }
  if (pIVar10 != (ImFontGlyph *)0x0) {
    pIVar10 = (this->Glyphs).Data;
    lVar14 = (long)iVar13;
    if (((undefined1  [40])pIVar10[lVar14 + -1] & (undefined1  [40])0xfffffffc) !=
        (undefined1  [40])0x24) {
      iVar20 = iVar13 + 1;
      iVar19 = (this->Glyphs).Capacity;
      if (iVar19 <= iVar13) {
        if (iVar19 == 0) {
          iVar19 = 8;
        }
        else {
          iVar19 = iVar19 / 2 + iVar19;
        }
        if (iVar19 <= iVar20) {
          iVar19 = iVar20;
        }
        pIVar10 = (ImFontGlyph *)ImGui::MemAlloc((long)iVar19 * 0x28);
        pIVar11 = (this->Glyphs).Data;
        if (pIVar11 != (ImFontGlyph *)0x0) {
          memcpy(pIVar10,pIVar11,(long)(this->Glyphs).Size * 0x28);
          ImGui::MemFree((this->Glyphs).Data);
        }
        (this->Glyphs).Data = pIVar10;
        (this->Glyphs).Capacity = iVar19;
        uVar16 = (this->IndexLookup).Size;
      }
      (this->Glyphs).Size = iVar20;
      lVar14 = (long)iVar20;
    }
    if ((uVar16 < 0x21) || (uVar12 = (ulong)(this->IndexLookup).Data[0x20], uVar12 == 0xffff)) {
      pIVar11 = this->FallbackGlyph;
    }
    else {
      pIVar11 = pIVar10 + uVar12;
    }
    fVar21 = pIVar11->V1;
    pIVar10[lVar14 + -1].U1 = pIVar11->U1;
    pIVar10[lVar14 + -1].V1 = fVar21;
    uVar6 = *(undefined4 *)&pIVar11->field_0x0;
    fVar7 = pIVar11->AdvanceX;
    fVar8 = pIVar11->X0;
    fVar9 = pIVar11->Y0;
    fVar21 = pIVar11->Y1;
    fVar4 = pIVar11->U0;
    fVar5 = pIVar11->V0;
    pIVar10[lVar14 + -1].X1 = pIVar11->X1;
    pIVar10[lVar14 + -1].Y1 = fVar21;
    pIVar10[lVar14 + -1].U0 = fVar4;
    pIVar10[lVar14 + -1].V0 = fVar5;
    *(undefined4 *)&pIVar10[lVar14 + -1].field_0x0 = uVar6;
    pIVar10[lVar14 + -1].AdvanceX = fVar7;
    pIVar10[lVar14 + -1].X0 = fVar8;
    pIVar10[lVar14 + -1].Y0 = fVar9;
    *(uint *)(pIVar10 + lVar14 + -1) = *(uint *)(pIVar10 + lVar14 + -1) & 3 | 0x24;
    fVar21 = pIVar10[lVar14 + -1].AdvanceX * 4.0;
    pIVar10[lVar14 + -1].AdvanceX = fVar21;
    (this->IndexAdvanceX).Data[9] = fVar21;
    (this->IndexLookup).Data[*(uint *)(pIVar10 + lVar14 + -1) >> 2] = (short)(this->Glyphs).Size - 1
    ;
    uVar16 = (this->IndexLookup).Size;
  }
  if ((uVar16 < 0x21) || (uVar18 = (this->IndexLookup).Data[0x20], uVar18 == 0xffff)) {
    pIVar10 = this->FallbackGlyph;
  }
  else {
    pIVar10 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar18 * 0x28);
  }
  if (pIVar10 != (ImFontGlyph *)0x0) {
    *(byte *)pIVar10 = *(byte *)pIVar10 & 0xfd;
    uVar16 = (this->IndexLookup).Size;
  }
  if ((uVar16 < 10) || (uVar18 = (this->IndexLookup).Data[9], uVar18 == 0xffff)) {
    pIVar10 = this->FallbackGlyph;
  }
  else {
    pIVar10 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar18 * 0x28);
  }
  if (pIVar10 != (ImFontGlyph *)0x0) {
    *(byte *)pIVar10 = *(byte *)pIVar10 & 0xfd;
    uVar16 = (this->IndexLookup).Size;
  }
  local_30[2] = 0x2026;
  local_30[3] = 0x85;
  local_30[0] = 0x2e;
  local_30[1] = 0xff0e;
  puVar2 = (this->IndexLookup).Data;
  uVar12 = (ulong)(int)uVar16;
  if (this->EllipsisChar == 0xffff) {
    lVar14 = 0;
    do {
      uVar18 = local_30[lVar14 + 2];
      if (((uVar18 < uVar12) && (puVar2[uVar18] != 0xffff)) &&
         ((this->Glyphs).Data != (ImFontGlyph *)0x0)) goto LAB_0020c418;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 2);
    uVar18 = 0xffff;
LAB_0020c418:
    this->EllipsisChar = uVar18;
  }
  if (this->DotChar == 0xffff) {
    lVar14 = 0;
    do {
      uVar18 = local_30[lVar14];
      if (((uVar18 < uVar12) && (puVar2[uVar18] != 0xffff)) &&
         ((this->Glyphs).Data != (ImFontGlyph *)0x0)) goto LAB_0020c451;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 2);
    uVar18 = 0xffff;
LAB_0020c451:
    this->DotChar = uVar18;
  }
  if ((this->FallbackChar < uVar12) && ((ulong)puVar2[this->FallbackChar] != 0xffff)) {
    pIVar10 = (this->Glyphs).Data;
    pIVar11 = pIVar10 + puVar2[this->FallbackChar];
    this->FallbackGlyph = pIVar11;
    if (pIVar10 != (ImFontGlyph *)0x0) goto LAB_0020c525;
    pIVar10 = (ImFontGlyph *)0x0;
  }
  else {
    this->FallbackGlyph = (ImFontGlyph *)0x0;
    pIVar10 = (this->Glyphs).Data;
  }
  lVar14 = 0;
  do {
    uVar18 = *(ushort *)((long)&DAT_0025e5c2 + lVar14);
    if ((uVar18 < uVar12) && (puVar2[uVar18] != 0xffff && pIVar10 != (ImFontGlyph *)0x0))
    goto LAB_0020c4dc;
    lVar14 = lVar14 + 2;
  } while (lVar14 != 6);
  uVar18 = 0xffff;
LAB_0020c4dc:
  this->FallbackChar = uVar18;
  if ((uVar18 < uVar12) && ((ulong)puVar2[uVar18] != 0xffff)) {
    pIVar11 = pIVar10 + puVar2[uVar18];
    this->FallbackGlyph = pIVar11;
    if (pIVar10 != (ImFontGlyph *)0x0) goto LAB_0020c525;
    pIVar10 = (ImFontGlyph *)0x0;
  }
  pIVar11 = pIVar10 + (long)(this->Glyphs).Size + -1;
  this->FallbackGlyph = pIVar11;
  this->FallbackChar = (ImWchar)(*(uint *)pIVar11 >> 2);
LAB_0020c525:
  fVar21 = pIVar11->AdvanceX;
  this->FallbackAdvanceX = fVar21;
  uVar12 = 0;
  do {
    pfVar3 = (this->IndexAdvanceX).Data;
    pfVar1 = pfVar3 + uVar12;
    if (*pfVar1 <= 0.0 && *pfVar1 != 0.0) {
      pfVar3[uVar12] = fVar21;
    }
    uVar12 = uVar12 + 1;
  } while (uVar17 != uVar12);
  return;
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    // Build lookup table
    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    memset(Used4kPagesMap, 0, sizeof(Used4kPagesMap));
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;

        // Mark 4K page as used
        const int page_n = codepoint / 4096;
        Used4kPagesMap[page_n >> 3] |= 1 << (page_n & 7);
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times (FIXME: Flaky)
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= IM_TABSIZE;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size - 1);
    }

    // Mark special glyphs as not visible (note that AddGlyph already mark as non-visible glyphs with zero-size polygons)
    SetGlyphVisible((ImWchar)' ', false);
    SetGlyphVisible((ImWchar)'\t', false);

    // Ellipsis character is required for rendering elided text. We prefer using U+2026 (horizontal ellipsis).
    // However some old fonts may contain ellipsis at U+0085. Here we auto-detect most suitable ellipsis character.
    // FIXME: Note that 0x2026 is rarely included in our font ranges. Because of this we are more likely to use three individual dots.
    const ImWchar ellipsis_chars[] = { (ImWchar)0x2026, (ImWchar)0x0085 };
    const ImWchar dots_chars[] = { (ImWchar)'.', (ImWchar)0xFF0E };
    if (EllipsisChar == (ImWchar)-1)
        EllipsisChar = FindFirstExistingGlyph(this, ellipsis_chars, IM_ARRAYSIZE(ellipsis_chars));
    if (DotChar == (ImWchar)-1)
        DotChar = FindFirstExistingGlyph(this, dots_chars, IM_ARRAYSIZE(dots_chars));

    // Setup fallback character
    const ImWchar fallback_chars[] = { (ImWchar)IM_UNICODE_CODEPOINT_INVALID, (ImWchar)'?', (ImWchar)' ' };
    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    if (FallbackGlyph == NULL)
    {
        FallbackChar = FindFirstExistingGlyph(this, fallback_chars, IM_ARRAYSIZE(fallback_chars));
        FallbackGlyph = FindGlyphNoFallback(FallbackChar);
        if (FallbackGlyph == NULL)
        {
            FallbackGlyph = &Glyphs.back();
            FallbackChar = (ImWchar)FallbackGlyph->Codepoint;
        }
    }

    FallbackAdvanceX = FallbackGlyph->AdvanceX;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}